

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t lzh_br_fillup(lzh_stream *strm,lzh_br *br)

{
  uint64_t uVar1;
  byte *pbVar2;
  ulong *puVar3;
  ulong uVar4;
  bool bVar5;
  wchar_t in_EAX;
  int iVar6;
  wchar_t wVar7;
  
  iVar6 = 0x40 - br->cache_avail;
  wVar7 = strm->avail_in;
  do {
    if (wVar7 < iVar6 >> 3) {
switchD_004ac811_caseD_1:
      if (wVar7 == L'\0') {
        in_EAX = L'\0';
        bVar5 = false;
      }
      else {
        uVar1 = br->cache_buffer;
        pbVar2 = strm->next_in;
        strm->next_in = pbVar2 + 1;
        br->cache_buffer = (ulong)*pbVar2 | uVar1 << 8;
        wVar7 = wVar7 + L'\xffffffff';
        strm->avail_in = wVar7;
        br->cache_avail = br->cache_avail + L'\b';
        iVar6 = iVar6 + -8;
        bVar5 = true;
      }
    }
    else {
      switch(iVar6 >> 3) {
      case 0:
        break;
      default:
        goto switchD_004ac811_caseD_1;
      case 6:
        pbVar2 = strm->next_in;
        br->cache_buffer =
             (ulong)pbVar2[5] |
             (ulong)pbVar2[4] << 8 |
             (ulong)pbVar2[3] << 0x10 |
             (ulong)pbVar2[2] << 0x18 |
             (ulong)pbVar2[1] << 0x20 | (ulong)*pbVar2 << 0x28 | br->cache_buffer << 0x30;
        strm->next_in = pbVar2 + 6;
        wVar7 = wVar7 + L'\xfffffffa';
        strm->avail_in = wVar7;
        br->cache_avail = br->cache_avail + L'0';
        break;
      case 7:
        pbVar2 = strm->next_in;
        br->cache_buffer =
             (ulong)pbVar2[6] |
             (ulong)pbVar2[5] << 8 |
             (ulong)pbVar2[4] << 0x10 |
             (ulong)pbVar2[3] << 0x18 |
             (ulong)pbVar2[2] << 0x20 |
             (ulong)pbVar2[1] << 0x28 | (ulong)*pbVar2 << 0x30 | br->cache_buffer << 0x38;
        strm->next_in = pbVar2 + 7;
        wVar7 = wVar7 + L'\xfffffff9';
        strm->avail_in = wVar7;
        br->cache_avail = br->cache_avail + L'8';
        break;
      case 8:
        puVar3 = (ulong *)strm->next_in;
        uVar4 = *puVar3;
        br->cache_buffer =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
        strm->next_in = (uchar *)(puVar3 + 1);
        wVar7 = wVar7 + L'\xfffffff8';
        strm->avail_in = wVar7;
        br->cache_avail = br->cache_avail + L'@';
      }
      bVar5 = false;
      in_EAX = L'\x01';
    }
    if (!bVar5) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

static int
lzh_br_fillup(struct lzh_stream *strm, struct lzh_br *br)
{
	int n = CACHE_BITS - br->cache_avail;

	for (;;) {
		const int x = n >> 3;
		if (strm->avail_in >= x) {
			switch (x) {
			case 8:
				br->cache_buffer =
				    ((uint64_t)strm->next_in[0]) << 56 |
				    ((uint64_t)strm->next_in[1]) << 48 |
				    ((uint64_t)strm->next_in[2]) << 40 |
				    ((uint64_t)strm->next_in[3]) << 32 |
				    ((uint32_t)strm->next_in[4]) << 24 |
				    ((uint32_t)strm->next_in[5]) << 16 |
				    ((uint32_t)strm->next_in[6]) << 8 |
				     (uint32_t)strm->next_in[7];
				strm->next_in += 8;
				strm->avail_in -= 8;
				br->cache_avail += 8 * 8;
				return (1);
			case 7:
				br->cache_buffer =
		 		   (br->cache_buffer << 56) |
				    ((uint64_t)strm->next_in[0]) << 48 |
				    ((uint64_t)strm->next_in[1]) << 40 |
				    ((uint64_t)strm->next_in[2]) << 32 |
				    ((uint32_t)strm->next_in[3]) << 24 |
				    ((uint32_t)strm->next_in[4]) << 16 |
				    ((uint32_t)strm->next_in[5]) << 8 |
				     (uint32_t)strm->next_in[6];
				strm->next_in += 7;
				strm->avail_in -= 7;
				br->cache_avail += 7 * 8;
				return (1);
			case 6:
				br->cache_buffer =
		 		   (br->cache_buffer << 48) |
				    ((uint64_t)strm->next_in[0]) << 40 |
				    ((uint64_t)strm->next_in[1]) << 32 |
				    ((uint32_t)strm->next_in[2]) << 24 |
				    ((uint32_t)strm->next_in[3]) << 16 |
				    ((uint32_t)strm->next_in[4]) << 8 |
				     (uint32_t)strm->next_in[5];
				strm->next_in += 6;
				strm->avail_in -= 6;
				br->cache_avail += 6 * 8;
				return (1);
			case 0:
				/* We have enough compressed data in
				 * the cache buffer.*/
				return (1);
			default:
				break;
			}
		}
		if (strm->avail_in == 0) {
			/* There is not enough compressed data to fill up the
			 * cache buffer. */
			return (0);
		}
		br->cache_buffer =
		   (br->cache_buffer << 8) | *strm->next_in++;
		strm->avail_in--;
		br->cache_avail += 8;
		n -= 8;
	}
}